

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O0

QString * __thiscall QTemporaryDir::errorString(QTemporaryDir *this)

{
  long *in_RSI;
  QString *in_RDI;
  
  if ((*(byte *)(*in_RSI + 0x19) & 1) == 0) {
    QString::QString(in_RDI,in_RDI);
  }
  else {
    QString::QString((QString *)0x2f6f2a);
  }
  return in_RDI;
}

Assistant:

QString QTemporaryDir::errorString() const
{
    return d_ptr->success ? QString() : d_ptr->pathOrError;
}